

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O1

varinfo * varinfo_new(vardata *data)

{
  int iVar1;
  int iVar2;
  varinfo *pvVar3;
  uint32_t *puVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  
  pvVar3 = (varinfo *)calloc(0x20,1);
  pvVar3->data = data;
  iVar1 = data->featuresnum + 0x1f;
  iVar2 = data->featuresnum + 0x3e;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  puVar4 = (uint32_t *)calloc(4,(long)(iVar2 >> 5));
  pvVar3->fmask = puVar4;
  iVar1 = data->varsetsnum;
  piVar5 = (int *)calloc(4,(long)iVar1);
  pvVar3->variants = piVar5;
  if (0 < (long)iVar1) {
    uVar7 = 1;
    if (1 < data->varsetsnum) {
      uVar7 = (ulong)(uint)data->varsetsnum;
    }
    memset(piVar5,0xff,uVar7 << 2);
  }
  iVar1 = data->modesetsnum;
  piVar5 = (int *)calloc(4,(long)iVar1);
  pvVar3->modes = piVar5;
  if (0 < (long)iVar1) {
    uVar7 = 1;
    if (1 < data->modesetsnum) {
      uVar7 = (ulong)(uint)data->modesetsnum;
    }
    piVar6 = &data->modesets->defmode;
    uVar8 = 0;
    do {
      piVar5[uVar8] = *piVar6;
      uVar8 = uVar8 + 1;
      piVar6 = piVar6 + 6;
    } while (uVar7 != uVar8);
  }
  return pvVar3;
}

Assistant:

struct varinfo *varinfo_new(struct vardata *data) {
	struct varinfo *res = calloc(sizeof *res, 1);
	int i;
	res->data = data;
	res->fmask = mask_new(data->featuresnum);
	res->variants = calloc(sizeof *res->variants, data->varsetsnum);
	for (i = 0; i < data->varsetsnum; i++)
		res->variants[i] = -1;
	res->modes = calloc(sizeof *res->modes, data->modesetsnum);
	for (i = 0; i < data->modesetsnum; i++)
		res->modes[i] = data->modesets[i].defmode;
	return res;
}